

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O2

bool __thiscall QHttpMultiPartIODevice::reset(QHttpMultiPartIODevice *this)

{
  ulong uVar1;
  bool bVar2;
  pointer pQVar3;
  QHttpPartPrivate *this_00;
  long lVar4;
  ulong uVar5;
  
  QIODevice::reset();
  uVar5 = 0xffffffffffffffff;
  lVar4 = 0;
  do {
    uVar1 = (this->multiPart->parts).d.size;
    uVar5 = uVar5 + 1;
    if (uVar1 <= uVar5) {
      this->readPointer = 0;
      break;
    }
    pQVar3 = QList<QHttpPart>::data(&this->multiPart->parts);
    this_00 = QSharedDataPointer<QHttpPartPrivate>::operator->
                        ((QSharedDataPointer<QHttpPartPrivate> *)((long)&(pQVar3->d).d.ptr + lVar4))
    ;
    bVar2 = QHttpPartPrivate::reset(this_00);
    lVar4 = lVar4 + 8;
  } while (bVar2);
  return uVar1 <= uVar5;
}

Assistant:

bool QHttpMultiPartIODevice::reset()
{
    // Reset QIODevice's data
    QIODevice::reset();
    for (int a = 0; a < multiPart->parts.size(); a++)
        if (!multiPart->parts[a].d->reset())
            return false;
    readPointer = 0;
    return true;
}